

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

void ncnn::im2col_sgemm_pack1to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int *piVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  undefined1 *puVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [16];
  uint uVar30;
  long lVar31;
  undefined1 (*pauVar32) [16];
  uint uVar33;
  size_t _elemsize;
  long lVar34;
  ulong *puVar35;
  long lVar36;
  long lVar37;
  undefined1 (*pauVar38) [16];
  int iVar39;
  undefined1 *puVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar49 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  long local_f0;
  Mat local_e8;
  ulong local_98;
  ulong local_90;
  Mat *local_88;
  Mat *local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  Mat *local_60;
  undefined1 local_58 [32];
  
  uVar1 = bottom_im2col->w;
  uVar33 = bottom_im2col->h;
  uVar24 = CONCAT44(0,uVar33);
  uVar30 = bottom_im2col->c;
  lVar43 = (long)(int)uVar30;
  local_90 = (ulong)(uint)top_blob->c;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  uVar16 = uVar1;
  uVar27 = uVar33;
  if (lVar43 < 4) {
    uVar21 = uVar30;
    if ((int)uVar1 < 4) {
      iVar18 = 1;
      _elemsize = 1;
      if ((int)uVar1 < 2) goto LAB_00284561;
      uVar27 = uVar33 * 2;
      uVar16 = (uVar1 & 1) + 1;
    }
    else {
      uVar16 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
      uVar27 = uVar33 * 4;
    }
    iVar18 = 1;
    _elemsize = 1;
  }
  else {
    if ((int)uVar1 < 4) {
      if ((int)uVar1 < 2) {
        iVar18 = 4;
        _elemsize = 4;
        uVar21 = (uVar30 & 3) + (uVar30 >> 2);
        goto LAB_00284561;
      }
      uVar27 = uVar33 * 2;
      uVar21 = (uVar30 & 3) + (uVar30 >> 2);
      uVar16 = (uVar1 & 1) + 1;
    }
    else {
      uVar27 = uVar33 * 4;
      uVar21 = (uVar30 & 3) + (uVar30 >> 2);
      uVar16 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
    }
    iVar18 = 4;
    _elemsize = 4;
  }
LAB_00284561:
  local_88 = top_blob;
  local_80 = kernel;
  Mat::create(&local_e8,uVar27,uVar21,uVar16,_elemsize,iVar18,opt->workspace_allocator);
  local_98 = (ulong)uVar30;
  uVar17 = (ulong)(int)uVar1;
  uVar16 = (int)uVar1 >> 2;
  local_58._0_8_ = uVar24;
  if (0 < (int)uVar16) {
    local_78 = (ulong)uVar16;
    local_f0 = 3;
    lVar36 = 1;
    uVar25 = 0;
    do {
      puVar40 = (undefined1 *)(local_e8.cstep * uVar25 * local_e8.elemsize + (long)local_e8.data);
      if ((int)uVar30 < 4) {
        uVar23 = 0;
      }
      else {
        lVar41 = 3;
        lVar22 = 2;
        lVar44 = 1;
        uVar28 = 0;
        do {
          if (0 < (int)uVar33) {
            lVar31 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar34 = lVar31 * lVar41;
            lVar19 = (long)bottom_im2col->data + local_f0;
            lVar26 = lVar31 * lVar22;
            lVar37 = lVar31 * uVar28;
            lVar31 = lVar31 * lVar44;
            uVar23 = uVar24;
            do {
              *puVar40 = *(undefined1 *)(lVar19 + -3 + lVar37);
              puVar40[1] = *(undefined1 *)(lVar19 + -3 + lVar31);
              puVar40[2] = *(undefined1 *)(lVar19 + -3 + lVar26);
              puVar40[3] = *(undefined1 *)(lVar19 + -3 + lVar34);
              puVar40[4] = *(undefined1 *)(lVar19 + -2 + lVar37);
              puVar40[5] = *(undefined1 *)(lVar19 + -2 + lVar31);
              puVar40[6] = *(undefined1 *)(lVar19 + -2 + lVar26);
              puVar40[7] = *(undefined1 *)(lVar19 + -2 + lVar34);
              puVar40[8] = *(undefined1 *)(lVar19 + -1 + lVar37);
              puVar40[9] = *(undefined1 *)(lVar19 + -1 + lVar31);
              puVar40[10] = *(undefined1 *)(lVar19 + -1 + lVar26);
              puVar40[0xb] = *(undefined1 *)(lVar19 + -1 + lVar34);
              puVar40[0xc] = *(undefined1 *)(lVar19 + lVar37);
              puVar40[0xd] = *(undefined1 *)(lVar19 + lVar31);
              puVar40[0xe] = *(undefined1 *)(lVar19 + lVar26);
              puVar40[0xf] = *(undefined1 *)(lVar19 + lVar34);
              puVar40 = puVar40 + 0x10;
              lVar19 = lVar19 + uVar17;
              uVar27 = (int)uVar23 - 1;
              uVar23 = (ulong)uVar27;
            } while (uVar27 != 0);
          }
          uVar23 = uVar28 + 4;
          lVar19 = uVar28 + 7;
          lVar41 = lVar41 + 4;
          lVar22 = lVar22 + 4;
          lVar44 = lVar44 + 4;
          uVar28 = uVar23;
          local_70 = uVar25;
          local_68 = lVar36;
        } while (lVar19 < lVar43);
      }
      if ((int)uVar23 < (int)uVar30) {
        uVar23 = uVar23 & 0xffffffff;
        do {
          if (0 < (int)uVar33) {
            puVar20 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + lVar36);
            uVar28 = uVar24;
            do {
              *puVar40 = puVar20[-1];
              puVar40[1] = *puVar20;
              puVar40[2] = puVar20[1];
              puVar40[3] = puVar20[2];
              puVar40 = puVar40 + 4;
              puVar20 = puVar20 + uVar17;
              uVar27 = (int)uVar28 - 1;
              uVar28 = (ulong)uVar27;
            } while (uVar27 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != local_98);
      }
      uVar25 = uVar25 + 1;
      local_f0 = local_f0 + 4;
      lVar36 = lVar36 + 4;
    } while (uVar25 != local_78);
  }
  uVar25 = uVar17 & 0xfffffffffffffffc;
  uVar27 = uVar1 >> 1 & 1;
  if (uVar27 != 0) {
    puVar40 = (undefined1 *)
              ((long)(int)uVar16 * local_e8.cstep * local_e8.elemsize + (long)local_e8.data);
    uVar23 = 0;
    if (3 < (int)uVar30) {
      lVar36 = 1;
      lVar22 = 2;
      lVar41 = 3;
      uVar28 = 0;
      do {
        if (0 < (int)uVar33) {
          pvVar2 = bottom_im2col->data;
          lVar19 = bottom_im2col->elemsize * bottom_im2col->cstep;
          lVar44 = (long)pvVar2 + lVar19 * uVar28 + 1;
          lVar31 = (long)pvVar2 + lVar19 * lVar36 + 1;
          lVar26 = (long)pvVar2 + lVar19 * lVar22 + 1;
          lVar19 = (long)pvVar2 + lVar19 * lVar41 + 1;
          uVar23 = uVar24;
          do {
            *puVar40 = *(undefined1 *)(lVar44 + -1 + uVar25);
            puVar40[1] = *(undefined1 *)(lVar31 + -1 + uVar25);
            puVar40[2] = *(undefined1 *)(lVar26 + -1 + uVar25);
            puVar40[3] = *(undefined1 *)(lVar19 + -1 + uVar25);
            puVar40[4] = *(undefined1 *)(lVar44 + uVar25);
            puVar40[5] = *(undefined1 *)(lVar31 + uVar25);
            puVar40[6] = *(undefined1 *)(lVar26 + uVar25);
            puVar40[7] = *(undefined1 *)(lVar19 + uVar25);
            puVar40 = puVar40 + 8;
            lVar44 = lVar44 + uVar17;
            lVar31 = lVar31 + uVar17;
            lVar26 = lVar26 + uVar17;
            lVar19 = lVar19 + uVar17;
            uVar16 = (int)uVar23 - 1;
            uVar23 = (ulong)uVar16;
          } while (uVar16 != 0);
        }
        uVar23 = uVar28 + 4;
        lVar44 = uVar28 + 7;
        lVar36 = lVar36 + 4;
        lVar22 = lVar22 + 4;
        lVar41 = lVar41 + 4;
        uVar28 = uVar23;
      } while (lVar44 < lVar43);
    }
    if ((int)uVar23 < (int)uVar30) {
      uVar23 = uVar23 & 0xffffffff;
      do {
        if (0 < (int)uVar33) {
          puVar20 = (undefined1 *)
                    ((long)bottom_im2col->data +
                    bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + uVar25 + 1);
          uVar28 = uVar24;
          do {
            *puVar40 = puVar20[-1];
            puVar40[1] = *puVar20;
            puVar40 = puVar40 + 2;
            puVar20 = puVar20 + uVar17;
            uVar16 = (int)uVar28 - 1;
            uVar28 = (ulong)uVar16;
          } while (uVar16 != 0);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != local_98);
    }
  }
  iVar18 = (int)uVar25 + uVar27 * 2;
  if (iVar18 < (int)uVar1) {
    uVar25 = (ulong)iVar18;
    do {
      uVar16 = (uint)uVar25;
      uVar27 = uVar16 + 3;
      if (-1 < (int)uVar16) {
        uVar27 = uVar16;
      }
      puVar40 = (undefined1 *)
                (local_e8.elemsize * local_e8.cstep *
                 (long)(int)((uVar16 - (((uint)(uVar25 >> 0x1f) & 1) + uVar16 & 0xfffffffe)) +
                             ((int)uVar27 >> 2) + (int)(uVar16 - (uVar27 & 0xfffffffc)) / 2) +
                (long)local_e8.data);
      if ((int)uVar30 < 4) {
        uVar23 = 0;
      }
      else {
        lVar36 = 1;
        lVar22 = 2;
        lVar41 = 3;
        uVar28 = 0;
        do {
          if (0 < (int)uVar33) {
            lVar44 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar19 = (long)bottom_im2col->data + uVar25;
            uVar23 = uVar24;
            do {
              *puVar40 = *(undefined1 *)(lVar19 + lVar44 * uVar28);
              puVar40[1] = *(undefined1 *)(lVar19 + lVar44 * lVar36);
              puVar40[2] = *(undefined1 *)(lVar19 + lVar44 * lVar22);
              puVar40[3] = *(undefined1 *)(lVar19 + lVar44 * lVar41);
              puVar40 = puVar40 + 4;
              lVar19 = lVar19 + uVar17;
              uVar16 = (int)uVar23 - 1;
              uVar23 = (ulong)uVar16;
            } while (uVar16 != 0);
          }
          uVar23 = uVar28 + 4;
          lVar44 = uVar28 + 7;
          lVar36 = lVar36 + 4;
          lVar22 = lVar22 + 4;
          lVar41 = lVar41 + 4;
          uVar28 = uVar23;
        } while (lVar44 < lVar43);
      }
      if ((int)uVar23 < (int)uVar30) {
        uVar23 = uVar23 & 0xffffffff;
        do {
          if (0 < (int)uVar33) {
            puVar20 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      uVar25 + bottom_im2col->cstep * uVar23 * bottom_im2col->elemsize);
            uVar28 = uVar24;
            do {
              *puVar40 = *puVar20;
              puVar40 = puVar40 + 1;
              puVar20 = puVar20 + uVar17;
              uVar16 = (int)uVar28 - 1;
              uVar28 = (ulong)uVar16;
            } while (uVar16 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != local_98);
      }
      uVar25 = uVar25 + 1;
      local_60 = bottom_im2col;
    } while (uVar25 != uVar17);
  }
  if (0 < (int)local_90) {
    uVar16 = uVar30 + 3;
    if (-1 < (int)uVar30) {
      uVar16 = uVar30;
    }
    iVar18 = ((int)uVar16 >> 2) * uVar33;
    iVar42 = ((int)uVar30 % 4) * uVar33;
    uVar24 = 0;
    do {
      pauVar29 = (undefined1 (*) [16])
                 (local_88->cstep * uVar24 * local_88->elemsize + (long)local_88->data);
      if ((int)uVar1 < 4) {
        uVar25 = 0;
      }
      else {
        uVar23 = 0;
        do {
          pauVar32 = (undefined1 (*) [16])
                     ((uVar23 >> 2) * local_e8.cstep * local_e8.elemsize + (long)local_e8.data);
          pauVar38 = (undefined1 (*) [16])
                     (local_80->cstep * uVar24 * local_80->elemsize + (long)local_80->data);
          auVar49 = ZEXT1664((undefined1  [16])0x0);
          if (iVar18 < 1) {
            auVar52 = ZEXT1664((undefined1  [16])0x0);
          }
          else {
            auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar54 = ZEXT1664((undefined1  [16])0x0);
            auVar56 = ZEXT1664((undefined1  [16])0x0);
            auVar58 = ZEXT1664((undefined1  [16])0x0);
            auVar52 = ZEXT1664((undefined1  [16])0x0);
            auVar53 = ZEXT1664((undefined1  [16])0x0);
            auVar57 = ZEXT1664((undefined1  [16])0x0);
            iVar39 = iVar18;
            do {
              local_58 = auVar59._0_32_;
              auVar3 = vpmovsxbw_avx2(*pauVar32);
              auVar12 = vpermq_avx2(auVar3,0x50);
              auVar13 = vpermq_avx2(auVar3,0xfa);
              auVar4 = vpmovsxbw_avx2(*pauVar38);
              auVar14 = vpermq_avx2(auVar3,5);
              auVar3 = vpermq_avx2(auVar3,0xaf);
              auVar6 = vpmullw_avx2(auVar12,auVar4);
              auVar12 = vpmulhw_avx2(auVar12,auVar4);
              auVar7 = vpmullw_avx2(auVar14,auVar4);
              auVar14 = vpmulhw_avx2(auVar14,auVar4);
              auVar8 = vpmullw_avx2(auVar13,auVar4);
              auVar13 = vpmulhw_avx2(auVar13,auVar4);
              auVar9 = vpmullw_avx2(auVar3,auVar4);
              auVar5 = vpmulhw_avx2(auVar3,auVar4);
              auVar3 = vpunpcklwd_avx2(auVar6,auVar12);
              auVar3 = vpaddd_avx2(auVar3,auVar49._0_32_);
              auVar49 = ZEXT3264(auVar3);
              auVar4 = vpunpcklwd_avx2(auVar7,auVar14);
              auVar4 = vpaddd_avx2(auVar4,auVar54._0_32_);
              auVar54 = ZEXT3264(auVar4);
              auVar12 = vpunpckhwd_avx2(auVar6,auVar12);
              auVar12 = vpaddd_avx2(auVar12,auVar56._0_32_);
              auVar56 = ZEXT3264(auVar12);
              auVar14 = vpunpckhwd_avx2(auVar7,auVar14);
              auVar14 = vpaddd_avx2(auVar58._0_32_,auVar14);
              auVar58 = ZEXT3264(auVar14);
              auVar6 = vpunpcklwd_avx2(auVar8,auVar13);
              auVar6 = vpaddd_avx2(local_58,auVar6);
              auVar59 = ZEXT3264(auVar6);
              auVar7 = vpunpcklwd_avx2(auVar9,auVar5);
              auVar7 = vpaddd_avx2(auVar7,auVar52._0_32_);
              auVar52 = ZEXT3264(auVar7);
              auVar13 = vpunpckhwd_avx2(auVar8,auVar13);
              auVar13 = vpaddd_avx2(auVar53._0_32_,auVar13);
              auVar53 = ZEXT3264(auVar13);
              auVar5 = vpunpckhwd_avx2(auVar9,auVar5);
              auVar5 = vpaddd_avx2(auVar57._0_32_,auVar5);
              auVar57 = ZEXT3264(auVar5);
              pauVar32 = pauVar32 + 1;
              pauVar38 = pauVar38 + 1;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
            auVar8 = vpunpckldq_avx2(auVar3,auVar4);
            auVar9 = vpunpckldq_avx2(auVar12,auVar14);
            auVar4 = vpunpckhdq_avx2(auVar3,auVar4);
            auVar12 = vpunpckhdq_avx2(auVar12,auVar14);
            auVar10 = vpunpckldq_avx2(auVar6,auVar7);
            auVar11 = vpunpckldq_avx2(auVar13,auVar5);
            auVar14 = vpunpckhdq_avx2(auVar6,auVar7);
            auVar6 = vpunpckhdq_avx2(auVar13,auVar5);
            auVar3 = vpunpckhdq_avx2(auVar8,auVar9);
            auVar7 = vpermq_avx2(auVar3,0x9c);
            auVar3 = vpunpckldq_avx2(auVar8,auVar9);
            auVar3 = vpermq_avx2(auVar3,0x9c);
            auVar3 = vpaddd_avx2(auVar3,auVar7);
            auVar7 = vpunpckhdq_avx2(auVar4,auVar12);
            auVar7 = vpermq_avx2(auVar7,0x9c);
            auVar4 = vpunpckldq_avx2(auVar4,auVar12);
            auVar4 = vpermq_avx2(auVar4,0x9c);
            auVar4 = vpaddd_avx2(auVar7,auVar4);
            auVar3 = vpaddd_avx2(auVar3,auVar4);
            auVar52 = ZEXT3264(auVar3);
            auVar3 = vpunpckhdq_avx2(auVar10,auVar11);
            auVar4 = vpermq_avx2(auVar3,0x9c);
            auVar3 = vpunpckldq_avx2(auVar10,auVar11);
            auVar3 = vpermq_avx2(auVar3,0x9c);
            auVar3 = vpaddd_avx2(auVar3,auVar4);
            auVar4 = vpunpckhdq_avx2(auVar14,auVar6);
            auVar12 = vpermq_avx2(auVar4,0x9c);
            auVar4 = vpunpckldq_avx2(auVar14,auVar6);
            auVar4 = vpermq_avx2(auVar4,0x9c);
            auVar4 = vpaddd_avx2(auVar12,auVar4);
            auVar3 = vpaddd_avx2(auVar3,auVar4);
            auVar49 = ZEXT3264(auVar3);
          }
          auVar48 = auVar49._0_16_;
          auVar55 = auVar52._0_16_;
          auVar47 = auVar52._16_16_;
          auVar50 = auVar49._16_16_;
          if (0 < iVar42) {
            lVar43 = 0;
            do {
              auVar55 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar32 + lVar43 * 4)));
              auVar55 = vpshuflw_avx(auVar55,0x50);
              auVar48 = vpshufd_avx(auVar55,0x50);
              auVar55 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar32 + lVar43 * 4 + 2)));
              auVar55 = vpshuflw_avx(auVar55,0x50);
              auVar46 = vpshufd_avx(auVar55,0x50);
              auVar55 = vpmovsxbw_avx(ZEXT416(*(uint *)(*pauVar38 + lVar43 * 4)));
              auVar55._8_8_ = auVar55._0_8_;
              auVar51 = vpmullw_avx(auVar55,auVar48);
              auVar48 = vpmulhw_avx(auVar48,auVar55);
              auVar45 = vpmullw_avx(auVar55,auVar46);
              auVar46 = vpmulhw_avx(auVar46,auVar55);
              auVar55 = vpunpcklwd_avx(auVar51,auVar48);
              auVar55 = vpaddd_avx(auVar52._0_16_,auVar55);
              auVar52 = ZEXT1664(auVar55);
              auVar48 = vpunpckhwd_avx(auVar51,auVar48);
              auVar47 = vpaddd_avx(auVar47,auVar48);
              auVar48 = vpunpcklwd_avx(auVar45,auVar46);
              auVar48 = vpaddd_avx(auVar49._0_16_,auVar48);
              auVar49 = ZEXT1664(auVar48);
              auVar46 = vpunpckhwd_avx(auVar45,auVar46);
              auVar50 = vpaddd_avx(auVar50,auVar46);
              lVar43 = lVar43 + 1;
            } while (iVar42 != (int)lVar43);
          }
          *pauVar29 = auVar55;
          pauVar29[1] = auVar47;
          pauVar29[2] = auVar48;
          pauVar29[3] = auVar50;
          pauVar29 = pauVar29 + 4;
          uVar25 = uVar23 + 4;
          lVar43 = uVar23 + 7;
          uVar23 = uVar25;
        } while (lVar43 < (long)uVar17);
      }
      uVar33 = (uint)uVar25 | 1;
      while (uVar30 = (uint)uVar25, (int)uVar33 < (int)uVar1) {
        pauVar32 = (undefined1 (*) [16])
                   (local_e8.elemsize * local_e8.cstep *
                    (ulong)(((uint)(uVar25 >> 2) & 0x3fffffff) + (uint)((uVar30 >> 1 & 1) != 0)) +
                   (long)local_e8.data);
        pauVar38 = (undefined1 (*) [16])
                   (local_80->cstep * uVar24 * local_80->elemsize + (long)local_80->data);
        auVar49 = ZEXT1664((undefined1  [16])0x0);
        if (0 < iVar18) {
          auVar52 = ZEXT1664((undefined1  [16])0x0);
          auVar53 = ZEXT1664((undefined1  [16])0x0);
          auVar54 = ZEXT1664((undefined1  [16])0x0);
          iVar39 = iVar18;
          do {
            auVar3 = vpmovsxbw_avx2(*pauVar32);
            auVar12 = vpermq_avx2(auVar3,0x50);
            auVar4 = vpmovsxbw_avx2(*pauVar38);
            auVar3 = vpermq_avx2(auVar3,5);
            auVar6 = vpmullw_avx2(auVar12,auVar4);
            auVar12 = vpmulhw_avx2(auVar12,auVar4);
            auVar7 = vpmullw_avx2(auVar3,auVar4);
            auVar14 = vpmulhw_avx2(auVar3,auVar4);
            auVar3 = vpunpcklwd_avx2(auVar6,auVar12);
            auVar3 = vpaddd_avx2(auVar54._0_32_,auVar3);
            auVar54 = ZEXT3264(auVar3);
            auVar4 = vpunpcklwd_avx2(auVar7,auVar14);
            auVar4 = vpaddd_avx2(auVar53._0_32_,auVar4);
            auVar53 = ZEXT3264(auVar4);
            auVar12 = vpunpckhwd_avx2(auVar6,auVar12);
            auVar12 = vpaddd_avx2(auVar52._0_32_,auVar12);
            auVar52 = ZEXT3264(auVar12);
            auVar14 = vpunpckhwd_avx2(auVar7,auVar14);
            auVar14 = vpaddd_avx2(auVar49._0_32_,auVar14);
            auVar49 = ZEXT3264(auVar14);
            pauVar32 = (undefined1 (*) [16])(*pauVar32 + 8);
            pauVar38 = pauVar38 + 1;
            iVar39 = iVar39 + -1;
          } while (iVar39 != 0);
          auVar6 = vpunpckldq_avx2(auVar3,auVar4);
          auVar7 = vpunpckldq_avx2(auVar12,auVar14);
          auVar4 = vpunpckhdq_avx2(auVar3,auVar4);
          auVar12 = vpunpckhdq_avx2(auVar12,auVar14);
          auVar3 = vpunpckhdq_avx2(auVar6,auVar7);
          auVar14 = vpermq_avx2(auVar3,0x9c);
          auVar3 = vpunpckldq_avx2(auVar6,auVar7);
          auVar3 = vpermq_avx2(auVar3,0x9c);
          auVar3 = vpaddd_avx2(auVar3,auVar14);
          auVar14 = vpunpckhdq_avx2(auVar4,auVar12);
          auVar14 = vpermq_avx2(auVar14,0x9c);
          auVar4 = vpunpckldq_avx2(auVar4,auVar12);
          auVar4 = vpermq_avx2(auVar4,0x9c);
          auVar4 = vpaddd_avx2(auVar14,auVar4);
          auVar3 = vpaddd_avx2(auVar3,auVar4);
          auVar49 = ZEXT3264(auVar3);
        }
        auVar55 = auVar49._0_16_;
        auVar47 = auVar49._16_16_;
        if (0 < iVar42) {
          lVar43 = 0;
          do {
            auVar55 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar32 + lVar43 * 2)));
            auVar55 = vpshuflw_avx(auVar55,0x50);
            auVar46 = vpshufd_avx(auVar55,0x50);
            auVar48._8_8_ = 0;
            auVar48._0_8_ = *(ulong *)(*pauVar38 + lVar43 * 4);
            auVar55 = vpmovsxbw_avx(auVar48);
            auVar51._0_8_ = auVar55._0_8_;
            auVar51._8_8_ = auVar51._0_8_;
            auVar50 = vpmullw_avx(auVar46,auVar51);
            auVar48 = vpmulhw_avx(auVar46,auVar51);
            auVar55 = vpunpcklwd_avx(auVar50,auVar48);
            auVar55 = vpaddd_avx(auVar49._0_16_,auVar55);
            auVar49 = ZEXT1664(auVar55);
            auVar48 = vpunpckhwd_avx(auVar50,auVar48);
            auVar47 = vpaddd_avx(auVar47,auVar48);
            lVar43 = lVar43 + 1;
          } while (iVar42 != (int)lVar43);
        }
        *pauVar29 = auVar55;
        pauVar29[1] = auVar47;
        pauVar29 = pauVar29 + 2;
        uVar25 = (ulong)(uVar30 + 2);
        uVar33 = uVar30 + 3;
      }
      if ((int)uVar30 < (int)uVar1) {
        do {
          uVar33 = (uint)uVar25;
          puVar35 = (ulong *)(local_e8.elemsize * local_e8.cstep *
                              (ulong)((uVar33 & 1) + ((uint)(uVar25 >> 2) & 0x3fffffff) +
                                     (uint)((uVar33 >> 1 & 1) != 0)) + (long)local_e8.data);
          pauVar32 = (undefined1 (*) [16])
                     (local_80->cstep * uVar24 * local_80->elemsize + (long)local_80->data);
          auVar49 = ZEXT1664((undefined1  [16])0x0);
          if (0 < iVar18) {
            auVar52 = ZEXT1664((undefined1  [16])0x0);
            auVar53 = ZEXT1664((undefined1  [16])0x0);
            auVar54 = ZEXT1664((undefined1  [16])0x0);
            iVar39 = iVar18;
            do {
              auVar47._8_8_ = 0;
              auVar47._0_8_ = *puVar35;
              auVar48 = vpmovsxbw_avx(auVar47);
              auVar55 = *pauVar32;
              auVar47 = vpcmpgtb_avx((undefined1  [16])0x0,auVar55);
              auVar50 = vpunpcklbw_avx(auVar55,auVar47);
              auVar55 = vpunpckhbw_avx(auVar55,auVar47);
              auVar45._0_8_ = auVar48._0_8_;
              auVar45._8_8_ = auVar45._0_8_;
              auVar48 = vpmullw_avx(auVar45,auVar50);
              auVar47 = vpmulhw_avx(auVar45,auVar50);
              auVar46 = vpmullw_avx(auVar45,auVar55);
              auVar50 = vpmulhw_avx(auVar45,auVar55);
              auVar55 = vpunpcklwd_avx(auVar48,auVar47);
              auVar55 = vpaddd_avx(auVar54._0_16_,auVar55);
              auVar54 = ZEXT1664(auVar55);
              auVar47 = vpunpckhwd_avx(auVar48,auVar47);
              auVar47 = vpaddd_avx(auVar53._0_16_,auVar47);
              auVar53 = ZEXT1664(auVar47);
              auVar48 = vpunpcklwd_avx(auVar46,auVar50);
              auVar48 = vpaddd_avx(auVar52._0_16_,auVar48);
              auVar52 = ZEXT1664(auVar48);
              auVar50 = vpunpckhwd_avx(auVar46,auVar50);
              auVar50 = vpaddd_avx(auVar49._0_16_,auVar50);
              auVar49 = ZEXT1664(auVar50);
              puVar35 = (ulong *)((long)puVar35 + 4);
              pauVar32 = pauVar32 + 1;
              iVar39 = iVar39 + -1;
            } while (iVar39 != 0);
            auVar46 = vpunpckldq_avx(auVar55,auVar47);
            auVar51 = vpunpckldq_avx(auVar48,auVar50);
            auVar47 = vpunpckhdq_avx(auVar55,auVar47);
            auVar48 = vpunpckhdq_avx(auVar48,auVar50);
            auVar50 = vpunpcklqdq_avx(auVar46,auVar51);
            auVar55 = vpunpckhqdq_avx(auVar46,auVar51);
            auVar55 = vpaddd_avx(auVar50,auVar55);
            auVar50 = vpunpcklqdq_avx(auVar47,auVar48);
            auVar47 = vpunpckhqdq_avx(auVar47,auVar48);
            auVar47 = vpaddd_avx(auVar47,auVar50);
            auVar55 = vpaddd_avx(auVar55,auVar47);
            auVar49 = ZEXT1664(auVar55);
          }
          auVar55 = auVar49._0_16_;
          if (0 < iVar42) {
            lVar43 = 0;
            do {
              auVar46._0_2_ = (short)*(char *)((long)puVar35 + lVar43);
              auVar46._2_2_ = auVar46._0_2_;
              auVar46._4_2_ = auVar46._0_2_;
              auVar46._6_2_ = auVar46._0_2_;
              auVar46._8_2_ = auVar46._0_2_;
              auVar46._10_2_ = auVar46._0_2_;
              auVar46._12_2_ = auVar46._0_2_;
              auVar46._14_2_ = auVar46._0_2_;
              auVar50._8_8_ = 0;
              auVar50._0_8_ = *(ulong *)(*pauVar32 + lVar43 * 4);
              auVar55 = vpmovsxbw_avx(auVar50);
              auVar47 = vpmullw_avx(auVar46,auVar55);
              auVar55 = vpmulhw_avx(auVar46,auVar55);
              auVar55 = vpunpcklwd_avx(auVar47,auVar55);
              auVar55 = vpaddd_avx(auVar49._0_16_,auVar55);
              auVar49 = ZEXT1664(auVar55);
              lVar43 = lVar43 + 1;
            } while (iVar42 != (int)lVar43);
          }
          *pauVar29 = auVar55;
          pauVar29 = pauVar29 + 1;
          uVar25 = (ulong)(uVar33 + 1);
        } while (uVar33 + 1 != uVar1);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != local_90);
  }
  piVar15 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack1to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}